

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shadertoy.cpp
# Opt level: O0

vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_> *
st::ParseOutputs(vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_> *__return_storage_ptr__
                ,Json *outputs)

{
  bool bVar1;
  vector<json11::Json,_std::allocator<json11::Json>_> *this;
  ShaderOutput SVar2;
  Json *pJVar3;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  value_type local_58;
  ShaderOutput data;
  Json *output;
  const_iterator __end2;
  const_iterator __begin2;
  array *__range2;
  Json *outputs_local;
  vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_> *ret;
  
  std::vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>::vector(__return_storage_ptr__);
  bVar1 = json11::Json::is_array(outputs);
  if (bVar1) {
    this = json11::Json::array_items(outputs);
    __end2 = std::vector<json11::Json,_std::allocator<json11::Json>_>::begin(this);
    output = (Json *)std::vector<json11::Json,_std::allocator<json11::Json>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_json11::Json_*,_std::vector<json11::Json,_std::allocator<json11::Json>_>_>
                                       *)&output), bVar1) {
      SVar2 = (ShaderOutput)
              __gnu_cxx::
              __normal_iterator<const_json11::Json_*,_std::vector<json11::Json,_std::allocator<json11::Json>_>_>
              ::operator*(&__end2);
      data = SVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"channel",&local_79);
      pJVar3 = json11::Json::operator[]((Json *)SVar2,&local_78);
      local_58.Channel = json11::Json::int_value(pJVar3);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      SVar2 = data;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"id",&local_a1);
      pJVar3 = json11::Json::operator[]((Json *)SVar2,&local_a0);
      local_58.ID = json11::Json::int_value(pJVar3);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      std::vector<st::ShaderOutput,_std::allocator<st::ShaderOutput>_>::push_back
                (__return_storage_ptr__,&local_58);
      __gnu_cxx::
      __normal_iterator<const_json11::Json_*,_std::vector<json11::Json,_std::allocator<json11::Json>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ShaderOutput> ParseOutputs(const json11::Json& outputs)
	{
		std::vector<ShaderOutput> ret;
		if (outputs.is_array()) {
			for (const auto& output : outputs.array_items()) {
				ShaderOutput data;
				data.Channel = output["channel"].int_value();
				data.ID = output["id"].int_value();
				ret.push_back(data);
			}
		}
		return ret;
	}